

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_SimAbsSolve(Gia_SimAbsMan_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  word *pwVar6;
  word *p_00;
  abctime aVar7;
  int local_4c;
  int CostMax;
  int CostThis;
  int iArgMax;
  word *pSimTable_1;
  word *pSimTable;
  word *pSimCand;
  int iPat2;
  int iPat;
  int k;
  int i;
  abctime clk;
  Gia_SimAbsMan_t *p_local;
  
  aVar5 = Abc_Clock();
  iVar1 = Vec_IntSize(p->vPatPairs);
  iVar1 = Abc_Bit6WordNum(iVar1 / 2);
  p->nWordsTable = iVar1;
  Vec_WrdFill(p->vCoverTable,p->nWordsTable * (p->nCands + 1),0);
  pwVar6 = Vec_WrdEntryP(p->vCoverTable,p->nWordsTable * p->nCands);
  p->pTableTemp = pwVar6;
  iPat = 0;
  do {
    if (p->nCands <= iPat) {
      Vec_IntClear(p->vResub);
      Abc_TtClear(p->pTableTemp,p->nWordsTable);
      for (iPat = 0; iVar1 = Vec_IntSize(p->vPatPairs), iPat < iVar1 / 2; iPat = iPat + 1) {
        Abc_TtXorBit(p->pTableTemp,iPat);
      }
      while (iVar1 = Abc_TtIsConst0(p->pTableTemp,p->nWordsTable), iVar1 == 0) {
        CostMax = -1;
        local_4c = -1;
        for (iPat = 0; iPat < p->nCands; iPat = iPat + 1) {
          pwVar6 = Vec_WrdEntryP(p->vCoverTable,p->nWordsTable * iPat);
          iVar1 = Abc_TtCountOnesVecMask(pwVar6,p->pTableTemp,p->nWordsTable,0);
          if (local_4c < iVar1) {
            CostMax = iPat;
            local_4c = iVar1;
          }
        }
        Vec_IntPush(p->vResub,CostMax);
        pwVar6 = Vec_WrdEntryP(p->vCoverTable,p->nWordsTable * CostMax);
        Abc_TtSharp(p->pTableTemp,p->pTableTemp,pwVar6,p->nWordsTable);
      }
      if (p->fVerbose != 0) {
        uVar4 = Vec_IntSize(p->vResub);
        iVar1 = Vec_IntSize(p->vPatPairs);
        printf("Solution %2d for covering problem [%5d x %5d]: ",(ulong)uVar4,
               (long)iVar1 / 2 & 0xffffffff,(ulong)(uint)p->nCands);
        for (iPat = 0; iVar1 = Vec_IntSize(p->vResub), iPat < iVar1; iPat = iPat + 1) {
          uVar4 = Vec_IntEntry(p->vResub,iPat);
          printf("%6d ",(ulong)uVar4);
        }
        for (; iPat < 0xc; iPat = iPat + 1) {
          printf("       ");
        }
        printf("   ");
        aVar7 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar7 - aVar5);
      }
      return;
    }
    pwVar6 = Vec_WrdEntryP(p->vSims,p->nWords * iPat);
    p_00 = Vec_WrdEntryP(p->vCoverTable,p->nWordsTable * iPat);
    for (iPat2 = 0; iVar1 = Vec_IntSize(p->vPatPairs), iPat2 + 1 < iVar1; iPat2 = iPat2 + 2) {
      iVar1 = Vec_IntEntry(p->vPatPairs,iPat2);
      iVar3 = Vec_IntEntry(p->vPatPairs,iPat2 + 1);
      iVar2 = Vec_IntEntry(p->vValues,iVar1);
      if (iVar2 != 0) {
        __assert_fail("Vec_IntEntry(p->vValues, iPat) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0x49f,"void Gia_SimAbsSolve(Gia_SimAbsMan_t *)");
      }
      iVar2 = Vec_IntEntry(p->vValues,iVar3);
      if (iVar2 != 1) {
        __assert_fail("Vec_IntEntry(p->vValues, iPat2) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0x4a0,"void Gia_SimAbsSolve(Gia_SimAbsMan_t *)");
      }
      iVar1 = Abc_TtGetBit(pwVar6,iVar1);
      iVar3 = Abc_TtGetBit(pwVar6,iVar3);
      if (iVar1 != iVar3) {
        Abc_TtXorBit(p_00,iPat2 / 2);
      }
    }
    iVar1 = Vec_IntSize(p->vPatPairs);
    if (iPat2 != iVar1) {
      __assert_fail("k == Vec_IntSize(p->vPatPairs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                    ,0x4a4,"void Gia_SimAbsSolve(Gia_SimAbsMan_t *)");
    }
    iPat = iPat + 1;
  } while( true );
}

Assistant:

void Gia_SimAbsSolve( Gia_SimAbsMan_t * p )
{
    abctime clk = Abc_Clock();
    int i, k, iPat, iPat2;
/*
    Vec_Int_t * vSimPats = Vec_IntDup( p->vPatPairs );
    Vec_IntUniqify( vSimPats );
    printf( "Selected %d pattern pairs contain %d unique patterns.\n", Vec_IntSize(p->vPatPairs)/2, Vec_IntSize(vSimPats) );
    Vec_IntFree( vSimPats );
*/
    // set up the covering problem
    p->nWordsTable = Abc_Bit6WordNum( Vec_IntSize(p->vPatPairs)/2 );
    Vec_WrdFill( p->vCoverTable, p->nWordsTable * (p->nCands + 1), 0 );
    p->pTableTemp = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * p->nCands );
    for ( i = 0; i < p->nCands; i++ )
    {
        word * pSimCand  = Vec_WrdEntryP( p->vSims, p->nWords * i );
        word * pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * i );
        //printf( "%4d : ", i );
        //Extra_PrintBinary( stdout, (word *)pSimCand, p->nCands );  printf( "\n" );
        Vec_IntForEachEntryDouble( p->vPatPairs, iPat, iPat2, k )
        {
            assert( Vec_IntEntry(p->vValues, iPat)  == 0 );
            assert( Vec_IntEntry(p->vValues, iPat2) == 1 );
            if ( Abc_TtGetBit(pSimCand, iPat) != Abc_TtGetBit(pSimCand, iPat2) )
                Abc_TtXorBit(pSimTable, k/2);
        }
        assert( k == Vec_IntSize(p->vPatPairs) );
    }

    if ( 0 )
    {
        printf( "                  " );
        for ( i = 0; i < p->nCands; i++ )
            printf( "%d", i % 10 );
        printf( "\n" );

        Vec_IntForEachEntryDouble( p->vPatPairs, iPat, iPat2, i )
        {
            printf( "%4d  ", i/2 );
            printf( "%4d  ", iPat );
            printf( "%4d  ", iPat2 );
            for ( k = 0; k < p->nCands; k++ )
            {
                word * pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * k );
                printf( "%c", Abc_TtGetBit(pSimTable, i/2) ? '*' : ' ' );
            }
            printf( "\n" );
        }
    }

    //Gia_SimAbsCheckSolution(p);

    Vec_IntClear( p->vResub );
    Abc_TtClear( p->pTableTemp, p->nWordsTable );
    for ( i = 0; i < Vec_IntSize(p->vPatPairs)/2; i++ )
        Abc_TtXorBit( p->pTableTemp, i );

    while ( !Abc_TtIsConst0(p->pTableTemp, p->nWordsTable) )
    {
        word * pSimTable;
        int iArgMax = -1, CostThis, CostMax = -1;
        // compute the cost of each column
        for ( i = 0; i < p->nCands; i++ )
        {
            pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * i );
            CostThis = Abc_TtCountOnesVecMask( pSimTable, p->pTableTemp, p->nWordsTable, 0 );
            if ( CostMax >= CostThis )
                continue;
            CostMax = CostThis;
            iArgMax = i;
        }
        // find the best column
        Vec_IntPush( p->vResub, iArgMax );
        // delete values of this column
        pSimTable = Vec_WrdEntryP( p->vCoverTable, p->nWordsTable * iArgMax );
        Abc_TtSharp( p->pTableTemp, p->pTableTemp, pSimTable, p->nWordsTable );
    }
    if ( p->fVerbose )
    {
        printf( "Solution %2d for covering problem [%5d x %5d]: ", Vec_IntSize(p->vResub), Vec_IntSize(p->vPatPairs)/2, p->nCands );
        Vec_IntForEachEntry( p->vResub, iPat, i )
            printf( "%6d ", iPat );
        for ( ; i < 12; i++ )
            printf( "       " );
        printf( "   " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
}